

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
TypedAttribute(TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
               *this)

{
  TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  this->_value_empty = false;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::
  optional<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::optional
            (&this->_attrib);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttribute() = default;